

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int aec_encode_get_offsets(aec_stream *strm,size_t *offsets,size_t offsets_count)

{
  internal_state *piVar1;
  vector_t *vec;
  int iVar2;
  size_t sVar3;
  size_t *__src;
  
  piVar1 = strm->state;
  vec = piVar1->offsets;
  if (vec == (vector_t *)0x0) {
    iVar2 = -5;
  }
  else {
    sVar3 = vector_size(vec);
    iVar2 = -4;
    if (sVar3 <= offsets_count) {
      __src = vector_data(piVar1->offsets);
      memcpy(offsets,__src,offsets_count << 3);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int aec_encode_get_offsets(struct aec_stream *strm, size_t *offsets, size_t offsets_count)
{
    struct internal_state *state = strm->state;
    if (state->offsets == NULL) {
        return AEC_RSI_OFFSETS_ERROR;
    }
    if (offsets_count < vector_size(state->offsets)) {
        return AEC_MEM_ERROR;
    }
    memcpy(offsets, vector_data(state->offsets), offsets_count * sizeof(size_t));
    return AEC_OK;
}